

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional.cxx
# Opt level: O1

vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *
ExchCXX::functional_factory
          (vector<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_> *__return_storage_ptr__,
          Backend backend,Functional func,Spin polar)

{
  exchcxx_exception *this;
  long lVar1;
  XCKernel local_80;
  undefined1 local_78 [8];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ExchCXX::XCKernel,_std::allocator<ExchCXX::XCKernel>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(func) {
  case SVWN3:
    XCKernel::XCKernel(&local_80,backend,SlaterExchange,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,VWN3,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case SVWN5:
    XCKernel::XCKernel(&local_80,backend,SlaterExchange,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,VWN5,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case BLYP:
    XCKernel::XCKernel(&local_80,backend,B88,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,LYP,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case B3LYP:
    XCKernel::XCKernel(&local_80,backend,B3LYP,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
    goto LAB_0016641f;
  case PBE:
    XCKernel::XCKernel(&local_80,backend,PBE_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,PBE_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case revPBE:
    XCKernel::XCKernel(&local_80,backend,revPBE_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,PBE_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case PBE0:
    XCKernel::XCKernel(&local_80,backend,PBE0,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
    goto LAB_0016641f;
  case SCAN:
    XCKernel::XCKernel(&local_80,backend,SCAN_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,SCAN_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case R2SCAN:
    XCKernel::XCKernel(&local_80,backend,R2SCAN_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,R2SCAN_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case R2SCANL:
    XCKernel::XCKernel(&local_80,backend,R2SCANL_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,R2SCANL_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case M062X:
    XCKernel::XCKernel(&local_80,backend,M062X_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,M062X_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case PKZB:
    XCKernel::XCKernel(&local_80,backend,PKZB_X,polar);
    XCKernel::XCKernel((XCKernel *)local_78,backend,PKZB_C,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,&local_70);
    lVar1 = 8;
    do {
      XCKernel::~XCKernel((XCKernel *)
                          ((long)&local_80.pimpl_._M_t.
                                  super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                                  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false> +
                          lVar1));
      lVar1 = lVar1 + -8;
    } while (lVar1 != -8);
    break;
  case EPC17_1:
    XCKernel::XCKernel(&local_80,backend,EPC17_1,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
    goto LAB_0016641f;
  case EPC17_2:
    XCKernel::XCKernel(&local_80,backend,EPC17_2,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
    goto LAB_0016641f;
  case EPC18_1:
    XCKernel::XCKernel(&local_80,backend,EPC18_1,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
    goto LAB_0016641f;
  case EPC18_2:
    XCKernel::XCKernel(&local_80,backend,EPC18_2,polar);
    std::vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>>::
    _M_assign_aux<ExchCXX::XCKernel_const*>
              ((vector<ExchCXX::XCKernel,std::allocator<ExchCXX::XCKernel>> *)__return_storage_ptr__
               ,&local_80,local_78);
LAB_0016641f:
    XCKernel::~XCKernel(&local_80);
    break;
  default:
    this = (exchcxx_exception *)__cxa_allocate_exception(0x50);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/xc_functional.cxx"
               ,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Functional NYI Through Builtin Backend","");
    exchcxx_exception::exchcxx_exception(this,&local_50,0x9d,&local_70);
    __cxa_throw(this,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< XCKernel > functional_factory( 
  const Backend        backend,
  const Functional func,
  const Spin          polar
) {

  std::vector< XCKernel > kerns;

  if( func == Functional::SVWN3 )
    kerns = { 
      XCKernel( backend, Kernel::SlaterExchange, polar ),
      XCKernel( backend, Kernel::VWN3,           polar )
    };
  else if( func == Functional::SVWN5 )
    kerns = { 
      XCKernel( backend, Kernel::SlaterExchange, polar ),
      XCKernel( backend, Kernel::VWN5,           polar )
    };
  else if( func == Functional::BLYP )
    kerns = { 
      XCKernel( backend, Kernel::B88, polar ),
      XCKernel( backend, Kernel::LYP, polar )
    };
  else if( func == Functional::B3LYP )
    kerns = { 
      XCKernel( backend, Kernel::B3LYP, polar )
    };
  else if( func == Functional::PBE )
    kerns = {
        XCKernel( backend, Kernel::PBE_X, polar ),
        XCKernel( backend, Kernel::PBE_C, polar )
    };
  else if( func == Functional::SCAN )
    kerns = {
        XCKernel( backend, Kernel::SCAN_X, polar ),
        XCKernel( backend, Kernel::SCAN_C, polar )
    };
  else if( func == Functional::R2SCAN )
    kerns = {
        XCKernel( backend, Kernel::R2SCAN_X, polar ),
        XCKernel( backend, Kernel::R2SCAN_C, polar )
    };
  else if( func == Functional::PKZB )
    kerns = {
        XCKernel( backend, Kernel::PKZB_X, polar ),
        XCKernel( backend, Kernel::PKZB_C, polar )
    };
  else if( func == Functional::M062X )
    kerns = {
        XCKernel( backend, Kernel::M062X_X, polar ),
        XCKernel( backend, Kernel::M062X_C, polar )
    };
  else if( func == Functional::R2SCANL )
    kerns = {
        XCKernel( backend, Kernel::R2SCANL_X, polar ),
        XCKernel( backend, Kernel::R2SCANL_C, polar )
    };
  else if( func == Functional::revPBE )
    kerns = {
        XCKernel( backend, Kernel::revPBE_X, polar ),
        XCKernel( backend, Kernel::PBE_C, polar )
    };
  else if( func == Functional::PBE0 )
    kerns = { 
      XCKernel( backend, Kernel::PBE0, polar )
    };
  else if( func == Functional::EPC17_1 )
    kerns = { 
      XCKernel( backend, Kernel::EPC17_1, polar )
    };
  else if( func == Functional::EPC17_2 )
    kerns = { 
      XCKernel( backend, Kernel::EPC17_2, polar )
    };
  else if( func == Functional::EPC18_1 )
    kerns = { 
      XCKernel( backend, Kernel::EPC18_1, polar )
    };
  else if( func == Functional::EPC18_2 )
    kerns = { 
      XCKernel( backend, Kernel::EPC18_2, polar )
    };
  else {
    EXCHCXX_BOOL_CHECK( "Functional NYI Through Builtin Backend", false );
  }


  return kerns;
}